

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

longdouble *
anon_unknown.dwarf_71df6::roundtrip<long_double>(longdouble *__return_storage_ptr__,longdouble *in)

{
  longdouble *plVar1;
  Result *in_R9;
  ExpressionDecomposer local_1e4;
  InputStream local_1e0;
  Expression_lhs<unsigned_long> local_1d8;
  Result local_1c0;
  OutputStream ostream;
  stringstream stream;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  std::ios::exceptions((int)*(undefined8 *)(_stream + -0x18) + (int)(stringstream *)&stream);
  ostream.stream = &stream;
  mserialize::serialize<long_double,OutputStream>(__return_storage_ptr__,&ostream);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1e4,DT_CHECK);
  local_1d8.lhs = std::ostream::tellp();
  local_1d8.m_at = local_1e4.m_at;
  local_1e0.stream = (stringstream *)0x10;
  doctest::detail::Expression_lhs<unsigned_long>::operator==
            (&local_1c0,&local_1d8,(unsigned_long *)&local_1e0);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x18c19c,(char *)0x36,0x18c3cc,&local_1c0.m_passed,in_R9);
  doctest::String::~String(&local_1c0.m_decomp);
  local_1e0.stream = &stream;
  mserialize::detail::TrivialDeserializer<long_double>::deserialize<InputStream>
            ((longdouble *)&local_1d8,&local_1e0);
  plVar1 = (longdouble *)std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return plVar1;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}